

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

void asmjit::_abi_1_10::x86::FuncInternal::unpackValues(FuncDetail *func,FuncValuePack *pack)

{
  uint uVar1;
  
  uVar1 = pack->_values[0]._data;
  if (((uVar1 & 0xfe) == 0x28) && (((func->_callConv)._arch & k32BitMask) != kUnknown)) {
    pack->_values[0]._data = 0x27;
    pack->_values[1]._data = uVar1 + 0x3e & 0x27;
  }
  return;
}

Assistant:

inline TypeId typeId() const noexcept { return TypeId((_data & kTypeIdMask) >> kTypeIdShift); }